

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O1

int polymul::polynomial<double,_3,_6>::term_index(int *exponents)

{
  int iVar1;
  int i;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  lVar3 = 0;
  iVar5 = 0;
  do {
    iVar5 = iVar5 + exponents[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (iVar5 < 1) {
    iVar4 = 0;
  }
  else {
    iVar5 = iVar5 + -1;
    uVar7 = 0;
    iVar6 = -3;
    iVar4 = 0;
    do {
      iVar2 = 1;
      if (uVar7 < 3) {
        iVar8 = 1;
        do {
          iVar2 = ((iVar5 + iVar8) * iVar2) / iVar8;
          iVar1 = iVar6 + iVar8;
          iVar8 = iVar8 + 1;
        } while (iVar1 != 0);
      }
      iVar4 = iVar4 + iVar2;
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 - exponents[uVar7];
      uVar7 = uVar7 + 1;
    } while (-1 < iVar5);
  }
  return iVar4;
}

Assistant:

static int term_index(const int exponents[Nvar]) {
    int N = 0;
    for (int i = 0; i < Nvar; i++)
      N += exponents[i];
    int i = 0, idx = 0;
    N--;
    while (N >= 0) {
      idx += polylen(Nvar - i, N);
      N -= exponents[i];
      i++;
    }
    return idx;
  }